

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyRecord.cpp
# Opt level: O1

void __thiscall Js::PropertyRecord::Dump(PropertyRecord *this,uint indent)

{
  uint32 uVar1;
  uint uVar2;
  undefined4 in_register_00000034;
  
  uVar2 = indent + 2;
  Output::Print(L"%*sPropertyRecord (0x%p):\n",CONCAT44(in_register_00000034,indent),L"",this);
  Output::Print(L"%*spid: %d\n",(ulong)uVar2,L"",(ulong)(uint)this->pid);
  Output::Print(L"%*shash: 0x%08x\n",(ulong)uVar2,L"",(ulong)this->hash);
  Output::Print(L"%*sisNumeric: %d\n",(ulong)uVar2,L"",(ulong)this->isNumeric);
  Output::Print(L"%*sIsBound: %d\n",(ulong)uVar2,L"",(ulong)this->isBound);
  Output::Print(L"%*sIsSymbol: %d\n",(ulong)uVar2,L"",(ulong)this->isSymbol);
  Output::Print(L"%*sbyteCount: %u\n",(ulong)uVar2,L"",(ulong)this->byteCount);
  if (this->isNumeric == true) {
    uVar1 = GetNumericValue(this);
    Output::Print(L"%*sbuffer (numeric): %u\n",(ulong)uVar2,L"",(ulong)uVar1);
    return;
  }
  Output::Print(L"%*sbuffer (string): %s\n",(ulong)uVar2,L"",this + 1);
  return;
}

Assistant:

void PropertyRecord::Dump(unsigned indent) const
    {
        const auto padding(_u(""));
        const unsigned fieldIndent(indent + 2);

        Output::Print(_u("%*sPropertyRecord (0x%p):\n"), indent, padding, this);
        Output::Print(_u("%*spid: %d\n"), fieldIndent, padding, this->pid);
        Output::Print(_u("%*shash: 0x%08x\n"), fieldIndent, padding, this->hash);
        Output::Print(_u("%*sisNumeric: %d\n"), fieldIndent, padding, this->isNumeric);
        Output::Print(_u("%*sIsBound: %d\n"), fieldIndent, padding, this->isBound);
        Output::Print(_u("%*sIsSymbol: %d\n"), fieldIndent, padding, this->isSymbol);
        Output::Print(_u("%*sbyteCount: %u\n"), fieldIndent, padding, this->byteCount);
        if (this->isNumeric)
        {
            Output::Print(_u("%*sbuffer (numeric): %u\n"), fieldIndent, padding, this->GetNumericValue());
        }
        else
        {
            Output::Print(_u("%*sbuffer (string): %s\n"), fieldIndent, padding, this->GetBuffer());
        }
    }